

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

void PushExpression(s_assenv *ae,int iw,e_expression zetype)

{
  char *pcVar1;
  int local_44;
  char *pcStack_40;
  int startptr;
  s_expression curexp;
  e_expression zetype_local;
  int iw_local;
  s_assenv *ae_local;
  
  curexp.ibank = zetype;
  curexp.iorgzone = iw;
  memset(&stack0xffffffffffffffc0,0,0x28);
  local_44 = 0;
  if (ae->nocode != 0) {
    switch(curexp.ibank) {
    case 0:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 1:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 2:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 3:
      ae->outputadr = ae->outputadr + 2;
      ae->codeadr = ae->codeadr + 2;
      break;
    case 4:
      ae->outputadr = ae->outputadr + 2;
      ae->codeadr = ae->codeadr + 2;
      break;
    case 5:
      ae->outputadr = ae->outputadr + 4;
      ae->codeadr = ae->codeadr + 4;
      break;
    case 6:
      ae->outputadr = ae->outputadr + 5;
      ae->codeadr = ae->codeadr + 5;
      break;
    case 7:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 8:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 9:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 10:
      ae->outputadr = ae->outputadr + 2;
      ae->codeadr = ae->codeadr + 2;
      break;
    case 0xb:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
      break;
    case 0xc:
      ae->outputadr = ae->outputadr + 1;
      ae->codeadr = ae->codeadr + 1;
    }
    if (ae->outputadr <= ae->maxptr) {
      return;
    }
    pcVar1 = GetCurrentFile(ae);
    rasm_printf(ae,"[%s:%d] NOCODE output exceed limit %d\n",pcVar1,(ulong)(uint)ae->wl[ae->idx].l,
                (ulong)(uint)ae->maxptr);
    FreeAssenv(ae);
    exit(3);
  }
  curexp.reference._0_4_ = curexp.iorgzone;
  curexp.o = ae->outputadr;
  curexp.ptr = curexp.ibank;
  curexp.zetype = ae->activebank;
  curexp.lz = ae->io + -1;
  curexp.wptr = ae->lz;
  if (ae->wl[curexp.iorgzone].e != 0) goto LAB_001335e7;
  if ((curexp.ibank == 0) || (curexp.ibank - 2U < 2)) {
LAB_00133521:
    local_44 = -1;
  }
  else if (curexp.ibank - 7U < 2) {
LAB_0013352a:
    local_44 = -2;
  }
  else if (curexp.ibank == 9) {
    local_44 = -3;
  }
  else {
    if (curexp.ibank == 10) goto LAB_0013352a;
    if (curexp.ibank == 0xc) goto LAB_00133521;
  }
  ae->codeadr = local_44 + ae->codeadr;
  if (((ae->ir == 0) && (ae->iw == 0)) && (ae->imacro == 0)) {
    ExpressionFastTranslate(ae,&ae->wl[curexp.iorgzone].w,1);
  }
  else {
    pcStack_40 = strdup(ae->wl[curexp.iorgzone].w);
    ExpressionFastTranslate(ae,&stack0xffffffffffffffc0,1);
  }
  ae->codeadr = ae->codeadr - local_44;
LAB_001335e7:
  switch(curexp.ibank) {
  case 0:
    curexp.iw = ae->codeadr + -1;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 1:
    curexp.iw = ae->codeadr;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 2:
    curexp.iw = ae->codeadr + -1;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 3:
    curexp.iw = ae->codeadr + -1;
    ae->outputadr = ae->outputadr + 2;
    ae->codeadr = ae->codeadr + 2;
    break;
  case 4:
    curexp.iw = ae->codeadr;
    ae->outputadr = ae->outputadr + 2;
    ae->codeadr = ae->codeadr + 2;
    break;
  case 5:
    curexp.iw = ae->codeadr;
    ae->outputadr = ae->outputadr + 4;
    ae->codeadr = ae->codeadr + 4;
    break;
  case 6:
    curexp.iw = ae->codeadr;
    ae->outputadr = ae->outputadr + 5;
    ae->codeadr = ae->codeadr + 5;
    break;
  case 7:
    curexp.iw = ae->codeadr + -2;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 8:
    curexp.iw = ae->codeadr + -2;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 9:
    curexp.iw = ae->codeadr + -3;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 10:
    curexp.iw = ae->codeadr + -2;
    ae->outputadr = ae->outputadr + 2;
    ae->codeadr = ae->codeadr + 2;
    break;
  case 0xb:
    curexp.iw = ae->codeadr;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
    break;
  case 0xc:
    curexp.iw = ae->codeadr + -1;
    ae->outputadr = ae->outputadr + 1;
    ae->codeadr = ae->codeadr + 1;
  }
  if (ae->outputadr <= ae->maxptr) {
    _internal_ObjectArrayAddDynamicValueConcat
              (&ae->expression,&ae->ie,&ae->me,&stack0xffffffffffffffc0,0x28,0x11a4,"PushExpression"
               ,"rasm.c");
    return;
  }
  pcVar1 = GetCurrentFile(ae);
  rasm_printf(ae,"[%s:%d] output exceed limit %d\n",pcVar1,(ulong)(uint)ae->wl[ae->idx].l,
              (ulong)(uint)ae->maxptr);
  FreeAssenv(ae);
  exit(3);
}

Assistant:

void PushExpression(struct s_assenv *ae,int iw,enum e_expression zetype)
{
	#undef FUNC
	#define FUNC "PushExpression"
	
	struct s_expression curexp={0};
	int startptr=0;

	if (!ae->nocode) {
		curexp.iw=iw;
		curexp.wptr=ae->outputadr;
		curexp.zetype=zetype;
		curexp.ibank=ae->activebank;
		curexp.iorgzone=ae->io-1;
		curexp.lz=ae->lz;
		/* on traduit de suite les variables du dictionnaire pour les boucles et increments
			SAUF si c'est une affectation */
		if (!ae->wl[iw].e) {
			switch (zetype) {
				case E_EXPRESSION_J8:
				case E_EXPRESSION_V8:
				case E_EXPRESSION_V16:
				case E_EXPRESSION_IM:startptr=-1;
							break;
				case E_EXPRESSION_IV8:
				case E_EXPRESSION_IV81:
				case E_EXPRESSION_IV16:startptr=-2;
							break;
				case E_EXPRESSION_3V8:startptr=-3;
							break;
				default:break;
			}
			/* hack pourri pour g�rer le $ */
			ae->codeadr+=startptr;
			/* ok mais les labels locaux des macros? */
			if (ae->ir || ae->iw || ae->imacro) {
				curexp.reference=TxtStrDup(ae->wl[iw].w);
				ExpressionFastTranslate(ae,&curexp.reference,1);
			} else {
				ExpressionFastTranslate(ae,&ae->wl[iw].w,1);
			}
			ae->codeadr-=startptr;
		}
		/* calcul adresse de reference et post-incrementation pour sauter les data */
		switch (zetype) {
			case E_EXPRESSION_J8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:curexp.ptr=ae->codeadr;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:curexp.ptr=ae->codeadr;ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:curexp.ptr=ae->codeadr;ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:curexp.ptr=ae->codeadr-1;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:curexp.ptr=ae->codeadr-3;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:curexp.ptr=ae->codeadr-2;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
			ObjectArrayAddDynamicValueConcat((void **)&ae->expression,&ae->ie,&ae->me,&curexp,sizeof(curexp));
		} else {
			rasm_printf(ae,"[%s:%d] output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	} else {
		switch (zetype) {
			case E_EXPRESSION_J8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
		} else {
			rasm_printf(ae,"[%s:%d] NOCODE output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	}
}